

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O0

void __thiscall FunctionReturned::FunctionReturned(FunctionReturned *this,Item *i)

{
  Item *i_local;
  FunctionReturned *this_local;
  
  Item::Item(&this->item,i);
  Exception::Exception(&this->exception,Nothing);
  this->isVoid = false;
  return;
}

Assistant:

FunctionReturned(Item i) : item(i), exception(Nothing), isVoid(false) {}